

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O1

bool __thiscall BigInt::LessThan(BigInt *this,BigInt *other)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  bVar4 = this->_isNegative;
  if ((bool)bVar4 == true) {
    if (other->_isNegative != true) {
      return true;
    }
  }
  else if (other->_isNegative != false) {
    return false;
  }
  piVar2 = (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (other->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (uint)((ulong)((long)(this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
  iVar5 = (int)((ulong)((long)(other->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
  if ((int)uVar6 < iVar5) {
    return true;
  }
  if (iVar5 < (int)uVar6) {
    return false;
  }
  bVar8 = 0 < (int)uVar6;
  if (0 < (int)uVar6) {
    uVar7 = 1;
    do {
      iVar5 = piVar3[uVar7 - 1];
      iVar1 = piVar2[uVar7 - 1];
      if (iVar1 < iVar5) {
        bVar4 = bVar4 ^ 1;
        break;
      }
      if (iVar5 < iVar1) break;
      bVar8 = uVar7 < (uVar6 & 0x7fffffff);
      bVar9 = uVar7 != (uVar6 & 0x7fffffff);
      uVar7 = uVar7 + 1;
    } while (bVar9);
  }
  return (bool)(bVar8 & bVar4);
}

Assistant:

bool BigInt::IsNegative() const
{
    return _isNegative;
}